

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::SPxDevexPR<double>::selectEnterHyperDim
          (SPxDevexPR<double> *this,double *best,double feastol)

{
  double dVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<double> *pSVar4;
  pointer pdVar5;
  pointer pdVar6;
  int *piVar7;
  SPxId SVar8;
  DataKey DVar9;
  long lVar10;
  int i;
  double dVar11;
  double dVar12;
  
  pSVar4 = (this->super_SPxPricer<double>).thesolver;
  pdVar5 = (pSVar4->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pSVar4->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = (long)(this->bestPrices).super_IdxSet.num;
  if (lVar10 < 1) {
    i = -1;
    dVar11 = -1.0;
  }
  else {
    piVar7 = (this->bestPrices).super_IdxSet.idx;
    lVar10 = lVar10 + 1;
    dVar11 = -1.0;
    i = -1;
    do {
      iVar2 = piVar7[lVar10 + -2];
      dVar1 = pdVar5[iVar2];
      if (-feastol <= dVar1) {
        iVar3 = (this->bestPrices).super_IdxSet.num;
        (this->bestPrices).super_IdxSet.num = iVar3 + -1;
        piVar7[lVar10 + -2] = piVar7[(long)iVar3 + -1];
        (pSVar4->isInfeasible).data[iVar2] = 0;
        dVar1 = dVar11;
      }
      else {
        dVar12 = feastol;
        if (feastol <= pdVar6[iVar2]) {
          dVar12 = pdVar6[iVar2];
        }
        dVar12 = (dVar1 * dVar1) / dVar12;
        if (*best <= dVar12 && dVar12 != *best) {
          *best = dVar12;
          this->last = pdVar6[iVar2];
          i = iVar2;
        }
        dVar1 = dVar12;
        if ((0.0 <= dVar11) && (dVar1 = dVar11, dVar12 < dVar11)) {
          dVar1 = dVar12;
        }
      }
      dVar11 = dVar1;
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
  }
  lVar10 = (long)(pSVar4->updateViols).super_IdxSet.num;
  if (0 < lVar10) {
    lVar10 = lVar10 + 1;
    do {
      pSVar4 = (this->super_SPxPricer<double>).thesolver;
      piVar7 = (pSVar4->isInfeasible).data;
      iVar2 = (pSVar4->updateViols).super_IdxSet.idx[lVar10 + -2];
      if (piVar7[iVar2] == 1) {
        dVar1 = pdVar5[iVar2];
        if (-feastol <= dVar1) {
          piVar7[iVar2] = 0;
        }
        else {
          dVar12 = feastol;
          if (feastol <= pdVar6[iVar2]) {
            dVar12 = pdVar6[iVar2];
          }
          dVar12 = (dVar1 * dVar1) / dVar12;
          if (dVar11 < dVar12) {
            if (*best <= dVar12 && dVar12 != *best) {
              *best = dVar12;
              this->last = pdVar6[iVar2];
              i = iVar2;
            }
            piVar7[iVar2] = 2;
            DIdxSet::addIdx(&this->bestPrices,iVar2);
          }
        }
      }
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
  }
  if (i < 0) {
    DVar9.info = 0;
    DVar9.idx = -1;
    return (SPxId)DVar9;
  }
  SVar8 = SPxSolverBase<double>::coId((this->super_SPxPricer<double>).thesolver,i);
  return (SPxId)SVar8.super_DataKey;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterHyperDim(R& best, R feastol)
{
   const R* cTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = cTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = cpen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indeces for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = cTest[idx];

         if(x < -feastol)
         {
            x = devexpr::computePrice(x, cpen[idx], feastol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
                  last = cpen[idx];
               }

               // put index into candidate list
               this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
               bestPrices.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);
   else
      return SPxId();
}